

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,
          small_vector<int,_4UL,_0UL,_std::allocator<int>_> *v,allocator<int> *alloc)

{
  type *ptVar1;
  type *ptVar2;
  size_t sVar3;
  size_type __n;
  
  this->m_dynamic_capacity = 0;
  this->m_dynamic_data = (pointer)0x0;
  __n = (long)v->m_end - (long)v->m_begin >> 2;
  if (__n < 5) {
    ptVar1 = this->m_static_data;
    this->m_end = (pointer)ptVar1;
    this->m_begin = (pointer)ptVar1;
    ptVar2 = (type *)v->m_begin;
    sVar3 = 4;
  }
  else {
    this->m_dynamic_capacity = __n;
    ptVar1 = (type *)std::allocator_traits<std::allocator<int>_>::allocate
                               ((allocator_type *)this,__n);
    this->m_dynamic_data = (pointer)ptVar1;
    this->m_end = (pointer)ptVar1;
    this->m_begin = (pointer)ptVar1;
    ptVar2 = (type *)v->m_begin;
    sVar3 = (long)v->m_end - (long)ptVar2 >> 2;
  }
  this->m_capacity = sVar3;
  for (; ptVar2 != (type *)v->m_end; ptVar2 = ptVar2 + 1) {
    *ptVar1 = *ptVar2;
    this->m_end = (pointer)(ptVar1 + 1);
    ptVar1 = ptVar1 + 1;
  }
  return;
}

Assistant:

small_vector(const small_vector& v, const Alloc& alloc)
        : m_alloc(alloc)
        , m_dynamic_capacity(0)
        , m_dynamic_data(nullptr)
    {
        if (v.size() > StaticCapacity)
        {
            m_dynamic_capacity = v.size();
            m_begin = m_end = m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
            m_capacity = v.size();
        }
        else
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }

        for (auto p = v.m_begin; p != v.m_end; ++p)
        {
            atraits::construct(get_alloc(), m_end, *p);
            ++m_end;
        }
    }